

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_ReservedFieldNumbersFailAsOneof_Test::
~CommandLineInterfaceTest_ReservedFieldNumbersFailAsOneof_Test
          (CommandLineInterfaceTest_ReservedFieldNumbersFailAsOneof_Test *this)

{
  CommandLineInterfaceTest_ReservedFieldNumbersFailAsOneof_Test *this_local;
  
  ~CommandLineInterfaceTest_ReservedFieldNumbersFailAsOneof_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, ReservedFieldNumbersFailAsOneof) {
  CreateTempFile("foo.proto",
                 R"(
syntax = "proto2";
message Foo {
  oneof one {
    int32 i = 19123;
  }
}
)");

  Run("protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto");

  ExpectErrorSubstring(
      "foo.proto: Field numbers 19000 through 19999 are reserved for the "
      "protocol buffer library implementation.");
}